

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLCMAC.cpp
# Opt level: O0

EVP_CIPHER * __thiscall OSSLCMACAES::getEVPCipher(OSSLCMACAES *this)

{
  long lVar1;
  undefined8 uVar2;
  long in_RDI;
  EVP_CIPHER *local_8;
  
  lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
  if (lVar1 == 0x80) {
    local_8 = EVP_aes_128_cbc();
  }
  else if (lVar1 == 0xc0) {
    local_8 = EVP_aes_192_cbc();
  }
  else if (lVar1 == 0x100) {
    local_8 = EVP_aes_256_cbc();
  }
  else {
    uVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
    softHSMLog(3,"getEVPCipher",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCMAC.cpp"
               ,0x4b,"Invalid AES bit len %i",uVar2);
    local_8 = (EVP_CIPHER *)0x0;
  }
  return (EVP_CIPHER *)local_8;
}

Assistant:

const EVP_CIPHER* OSSLCMACAES::getEVPCipher() const
{
	switch(currentKey->getBitLen())
	{
		case 128:
			return EVP_aes_128_cbc();
		case 192:
			return EVP_aes_192_cbc();
		case 256:
			return EVP_aes_256_cbc();
		default:
			break;
	};

	ERROR_MSG("Invalid AES bit len %i", currentKey->getBitLen());

	return NULL;
}